

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O1

int LiteScript::Syntax::ReadBreak
              (char *text,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint i;
  ulong uVar4;
  string keyword;
  Instruction local_60;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  uVar1 = ReadName(text,&local_50);
  uVar4 = 0;
  if (uVar1 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar2 == 0) {
      uVar1 = 0;
      while( true ) {
        while( true ) {
          if ((0x20 < (ulong)(byte)text[(ulong)uVar1 + 5]) ||
             ((0x100000600U >> ((ulong)(byte)text[(ulong)uVar1 + 5] & 0x3f) & 1) == 0)) break;
          uVar1 = uVar1 + 1;
        }
        uVar3 = ReadComment(text + (ulong)uVar1 + 5);
        if (uVar3 == 0) break;
        uVar1 = uVar1 + uVar3;
      }
      Instruction::Instruction(&local_60,INSTR_JUMP_TO,"break");
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
      emplace_back<LiteScript::Instruction>(instrl,&local_60);
      uVar4 = (long)(int)uVar1 + 5;
      Instruction::~Instruction(&local_60);
      if (text[uVar4] == ';') {
        uVar4 = (ulong)(uVar1 + 6);
      }
      else {
        *errorType = SCRPT_ERROR_SEMICOLON;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return (int)uVar4;
}

Assistant:

int LiteScript::Syntax::ReadBreak(const char *text, std::vector<Instruction> &instrl, Script::ErrorType &errorType) {
    std::string keyword;
    if (ReadName(text, keyword) == 0 || keyword != "break")
        return 0;
    int i = 5;
    i += (int)ReadWhitespace(text + i);
    instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO, "break"));
    if (text[i] != ';') {
        errorType = Script::ErrorType::SCRPT_ERROR_SEMICOLON;
        return i;
    }
    return i + 1;
}